

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_0,_9,_2,_3>::evaluate
               (ShaderEvalContext *evalCtx)

{
  float *pfVar1;
  int row_1;
  undefined4 *puVar2;
  int row;
  long lVar3;
  float *pfVar4;
  int col;
  long lVar5;
  float v;
  float fVar6;
  Vector<float,_3> res;
  undefined8 local_50;
  float local_48;
  int aiStack_40 [6];
  float local_28 [10];
  
  pfVar1 = local_28;
  local_28[4] = 0.0;
  local_28[5] = 0.0;
  local_28[6] = 0.0;
  local_28[7] = 0.0;
  local_28[0] = 0.0;
  local_28[1] = 0.0;
  local_28[2] = 0.0;
  local_28[3] = 0.0;
  local_28[8] = 0.0;
  puVar2 = &s_constInMat3;
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)pfVar1 + lVar5) = *(undefined4 *)((long)puVar2 + lVar5);
      lVar5 = lVar5 + 0xc;
    } while (lVar5 != 0x24);
    lVar3 = lVar3 + 1;
    pfVar1 = pfVar1 + 1;
    puVar2 = puVar2 + 1;
  } while (lVar3 != 3);
  local_50 = *(undefined8 *)(evalCtx->coords).m_data;
  local_48 = (evalCtx->coords).m_data[2];
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  pfVar1 = local_28;
  lVar3 = 0;
  do {
    fVar6 = 0.0;
    lVar5 = 0;
    pfVar4 = pfVar1;
    do {
      fVar6 = fVar6 + *pfVar4 * *(float *)((long)&local_50 + lVar5 * 4);
      lVar5 = lVar5 + 1;
      pfVar4 = pfVar4 + 3;
    } while (lVar5 != 3);
    res.m_data[lVar3] = fVar6;
    lVar3 = lVar3 + 1;
    pfVar1 = pfVar1 + 1;
  } while (lVar3 != 3);
  aiStack_40[2] = 0;
  aiStack_40[3] = 1;
  aiStack_40[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[aiStack_40[lVar3]] = res.m_data[lVar3 + -2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

inline Vector<T, Size>::Vector (void)
{
	for (int i = 0; i < Size; i++)
		m_data[i] = T();
}